

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmconsol.cpp
# Opt level: O2

int __thiscall
CVmConsole::open_script_file
          (CVmConsole *this,vm_val_t *filespec,vm_rcdesc *rc,int quiet,int script_more_mode)

{
  err_frame_t *peVar1;
  CVmException *pCVar2;
  int iVar3;
  undefined8 *puVar4;
  long *plVar5;
  undefined4 extraout_var;
  CVmNetFile *nf;
  err_frame_t err_cur__;
  
  puVar4 = (undefined8 *)_ZTW11G_err_frame();
  err_cur__.prv_ = (err_frame_t *)*puVar4;
  plVar5 = (long *)_ZTW11G_err_frame();
  *plVar5 = (long)&err_cur__;
  err_cur__.state_ = _setjmp((__jmp_buf_tag *)err_cur__.jmpbuf_);
  if (err_cur__.state_ == 1) {
    err_cur__.state_ = 2;
  }
  else if (err_cur__.state_ == 0) {
    iVar3 = CVmNetFile::open((char *)filespec,(int)rc,1,5,"text/plain");
    nf = (CVmNetFile *)CONCAT44(extraout_var,iVar3);
    CVmObjFile::check_safety_for_open(nf,1);
    if (err_cur__.state_ != 1) goto LAB_0026ad9f;
    err_cur__.state_ = 2;
    if (nf != (CVmNetFile *)0x0) {
      CVmNetFile::abandon(nf);
      err_rethrow();
      goto LAB_0026ad9f;
    }
  }
  nf = (CVmNetFile *)0x0;
LAB_0026ad9f:
  peVar1 = err_cur__.prv_;
  puVar4 = (undefined8 *)_ZTW11G_err_frame();
  *puVar4 = peVar1;
  if ((err_cur__.state_ & 0x4001U) != 0) {
    puVar4 = (undefined8 *)_ZTW11G_err_frame();
    if ((*(byte *)*puVar4 & 2) != 0) {
      plVar5 = (long *)_ZTW11G_err_frame();
      free(*(void **)(*plVar5 + 0x10));
    }
    pCVar2 = err_cur__.exc_;
    plVar5 = (long *)_ZTW11G_err_frame();
    *(CVmException **)(*plVar5 + 0x10) = pCVar2;
    err_rethrow();
  }
  if ((err_cur__.state_ & 2U) != 0) {
    free(err_cur__.exc_);
  }
  iVar3 = open_script_file(this,nf,filespec,quiet,script_more_mode);
  return iVar3;
}

Assistant:

int CVmConsole::open_script_file(VMG_ const vm_val_t *filespec,
                                 const struct vm_rcdesc *rc,
                                 int quiet, int script_more_mode)
{
    CVmNetFile *nf = 0;
    err_try
    {
        /* create the network file descriptor */
        nf = CVmNetFile::open(
            vmg_ filespec, rc, NETF_READ, OSFTCMD, "text/plain");

        /* validate file safety */
        CVmObjFile::check_safety_for_open(vmg_ nf, VMOBJFILE_ACCESS_READ);
    }